

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csvparams_tests.cpp
# Opt level: O0

void __thiscall
iu_CsvParamsIntTest_x_iutest_x_Param_Test::~iu_CsvParamsIntTest_x_iutest_x_Param_Test
          (iu_CsvParamsIntTest_x_iutest_x_Param_Test *this)

{
  iu_CsvParamsIntTest_x_iutest_x_Param_Test *this_local;
  
  ~iu_CsvParamsIntTest_x_iutest_x_Param_Test(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

IUTEST_P(CsvParamsIntTest, Param)
{
    IUTEST_EXPECT_NE( 0, GetParam() );
#if IUTEST_HAS_MATCHERS
    IUTEST_ASSERT_THAT( check_params, Contains( GetParam() ) );
#endif
    for( size_t i=0; i < IUTEST_PP_COUNTOF(check_params); ++i )
    {
        if( check_params[i] == GetParam() )
        {
            check_params[i] = 0;
            break;
        }
    }
}